

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void on_signal_close(int sig)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  _Base_ptr p_Var8;
  mapped_type *pmVar9;
  uchar extraout_RDX [8];
  uchar extraout_RDX_00 [8];
  uchar extraout_RDX_01 [8];
  sockaddr_in addr;
  sockaddr_in addr_00;
  sockaddr_in addr_01;
  int new_parent;
  int ch;
  _Rb_tree_color local_58;
  _Rb_tree_color local_54;
  string local_50;
  
  fwrite("Call exit function\n",0x13,1,_stderr);
  if (flag_root == false) {
    addr.sin_zero[0] = extraout_RDX[0];
    addr.sin_zero[1] = extraout_RDX[1];
    addr.sin_zero[2] = extraout_RDX[2];
    addr.sin_zero[3] = extraout_RDX[3];
    addr.sin_zero[4] = extraout_RDX[4];
    addr.sin_zero[5] = extraout_RDX[5];
    addr.sin_zero[6] = extraout_RDX[6];
    addr.sin_zero[7] = extraout_RDX[7];
    addr.sin_family = my_addr.sin_family;
    addr.sin_port = my_addr.sin_port;
    addr.sin_addr.s_addr = my_addr.sin_addr.s_addr;
    pack_address_abi_cxx11_(&local_50,addr);
    std::__cxx11::string::operator=((string *)&tosend_address_abi_cxx11_,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    create_new_message(2,id_parent);
  }
  fprintf(_stderr,"Children size: %ld\n",
          CONCAT44(children._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                   (int)children._M_t._M_impl.super__Rb_tree_header._M_node_count));
  if ((int)children._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if (flag_root == true) {
      local_58 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      create_new_message(4,local_58);
    }
    else {
      local_58 = id_parent;
    }
    if ((_Rb_tree_header *)children._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &children._M_t._M_impl.super__Rb_tree_header) {
      p_Var8 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_54 = p_Var8[1]._M_color;
        if (local_54 != local_58) {
          pmVar9 = std::
                   map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
                   ::operator[](&connections,(key_type *)&local_58);
          uVar1 = pmVar9->sin_family;
          uVar3 = pmVar9->sin_port;
          uVar5 = pmVar9->sin_addr;
          addr_00.sin_addr.s_addr = uVar5;
          addr_00.sin_port = uVar3;
          addr_00.sin_family = uVar1;
          addr_00.sin_zero[0] = extraout_RDX_00[0];
          addr_00.sin_zero[1] = extraout_RDX_00[1];
          addr_00.sin_zero[2] = extraout_RDX_00[2];
          addr_00.sin_zero[3] = extraout_RDX_00[3];
          addr_00.sin_zero[4] = extraout_RDX_00[4];
          addr_00.sin_zero[5] = extraout_RDX_00[5];
          addr_00.sin_zero[6] = extraout_RDX_00[6];
          addr_00.sin_zero[7] = extraout_RDX_00[7];
          pack_address_abi_cxx11_(&local_50,addr_00);
          std::__cxx11::string::operator=((string *)&tosend_address_abi_cxx11_,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          create_new_message(3,local_54);
          pmVar9 = std::
                   map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
                   ::operator[](&connections,(key_type *)&local_54);
          uVar2 = pmVar9->sin_family;
          uVar4 = pmVar9->sin_port;
          uVar6 = pmVar9->sin_addr;
          addr_01.sin_addr.s_addr = uVar6;
          addr_01.sin_port = uVar4;
          addr_01.sin_family = uVar2;
          addr_01.sin_zero[0] = extraout_RDX_01[0];
          addr_01.sin_zero[1] = extraout_RDX_01[1];
          addr_01.sin_zero[2] = extraout_RDX_01[2];
          addr_01.sin_zero[3] = extraout_RDX_01[3];
          addr_01.sin_zero[4] = extraout_RDX_01[4];
          addr_01.sin_zero[5] = extraout_RDX_01[5];
          addr_01.sin_zero[6] = extraout_RDX_01[6];
          addr_01.sin_zero[7] = extraout_RDX_01[7];
          pack_address_abi_cxx11_(&local_50,addr_01);
          std::__cxx11::string::operator=((string *)&tosend_address_abi_cxx11_,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          create_new_message(5,local_58);
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &children._M_t._M_impl.super__Rb_tree_header);
    }
  }
  while (MT._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    lVar7 = std::chrono::_V2::system_clock::now();
    check_and_resend(lVar7 / 1000);
  }
  exit(0);
}

Assistant:

void on_signal_close(int sig) {
    fprintf(stderr, "Call exit function\n");

    if (!flag_root) {
        tosend_address = pack_address(my_addr);
        create_new_message(LEFT, id_parent);
    }

    fprintf(stderr, "Children size: %ld\n", children.size());
    int sz = (int)children.size();
    if (sz) {
        int new_parent;
        if (flag_root) {
            new_parent = *children.begin();
            create_new_message(ROOT, new_parent);
        }
        else {
            new_parent = id_parent;
        }
        for (auto ch : children) {
            if (ch != new_parent) {
                tosend_address = pack_address(connections[new_parent]);
                create_new_message(PARENT, ch);
                tosend_address = pack_address(connections[ch]);
                create_new_message(CHILD, new_parent);
            }
        }
    }

    while (!MT.empty()) {
        auto cur_time = std::chrono::high_resolution_clock::now().time_since_epoch();
        check_and_resend(std::chrono::duration_cast<std::chrono::microseconds>(cur_time).count());
    }

    exit(0);
}